

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O0

double calc_kurtosis_weighted<double,int,double>
                 (size_t col_num,size_t nrows,double *Xc,int *Xc_ind,int *Xc_indptr,
                 MissingAction missing_action,double *w)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  int in_R9D;
  double dVar5;
  double dVar6;
  int *__value;
  double dVar7;
  undefined1 auVar8 [16];
  long in_stack_00000008;
  double out;
  double v;
  double sn;
  int ix_2;
  int ix_1;
  double xval;
  int ix;
  double cnt;
  double w_this;
  double x_sq;
  double s4;
  double s3;
  double s2;
  double s1;
  double local_b8;
  undefined6 in_stack_ffffffffffffff58;
  undefined1 uVar9;
  byte in_stack_ffffffffffffff5f;
  int *in_stack_ffffffffffffff60;
  int *Xc_indptr_00;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  int local_74;
  double local_70;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_8;
  
  if (*(int *)(in_R8 + in_RDI * 4) == *(int *)(in_R8 + 4 + in_RDI * 4)) {
    local_8 = -INFINITY;
  }
  else {
    local_40 = 0.0;
    local_48 = 0.0;
    local_50 = 0.0;
    local_58 = 0.0;
    lVar4 = in_RSI - (*(int *)(in_R8 + 4 + in_RDI * 4) - *(int *)(in_R8 + in_RDI * 4));
    auVar8._8_4_ = (int)((ulong)lVar4 >> 0x20);
    auVar8._0_8_ = lVar4;
    auVar8._12_4_ = 0x45300000;
    local_70 = (auVar8._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0);
    for (local_74 = *(int *)(in_R8 + in_RDI * 4); local_74 < *(int *)(in_R8 + 4 + in_RDI * 4);
        local_74 = local_74 + 1) {
      local_70 = *(double *)(in_stack_00000008 + (long)*(int *)(in_RCX + (long)local_74 * 4) * 8) +
                 local_70;
    }
    if (local_70 <= 0.0) {
      local_8 = -INFINITY;
    }
    else {
      if (in_R9D == 0) {
        for (in_stack_ffffffffffffff78 = *(int *)(in_R8 + in_RDI * 4);
            in_stack_ffffffffffffff78 < *(int *)(in_R8 + 4 + in_RDI * 4);
            in_stack_ffffffffffffff78 = in_stack_ffffffffffffff78 + 1) {
          dVar6 = *(double *)
                   (in_stack_00000008 +
                   (long)*(int *)(in_RCX + (long)in_stack_ffffffffffffff78 * 4) * 8);
          dVar7 = *(double *)(in_RDX + (long)in_stack_ffffffffffffff78 * 8);
          dVar5 = dVar7 * dVar7;
          local_40 = fma(dVar6,dVar7,local_40);
          local_48 = fma(dVar6,dVar5,local_48);
          local_50 = fma(dVar6,dVar5 * dVar7,local_50);
          local_58 = fma(dVar6,dVar5 * dVar5,local_58);
        }
      }
      else {
        for (in_stack_ffffffffffffff7c = *(int *)(in_R8 + in_RDI * 4);
            in_stack_ffffffffffffff7c < *(int *)(in_R8 + 4 + in_RDI * 4);
            in_stack_ffffffffffffff7c = in_stack_ffffffffffffff7c + 1) {
          dVar6 = *(double *)
                   (in_stack_00000008 +
                   (long)*(int *)(in_RCX + (long)in_stack_ffffffffffffff7c * 4) * 8);
          dVar7 = *(double *)(in_RDX + (long)in_stack_ffffffffffffff7c * 8);
          uVar2 = std::isnan(dVar7);
          in_stack_ffffffffffffff5f = 1;
          if ((uVar2 & 1) == 0) {
            iVar3 = std::isinf(dVar7);
            in_stack_ffffffffffffff5f = (byte)iVar3;
          }
          if ((in_stack_ffffffffffffff5f & 1) == 0) {
            dVar5 = dVar7 * dVar7;
            local_40 = fma(dVar6,dVar7,local_40);
            local_48 = fma(dVar6,dVar5,local_48);
            local_50 = fma(dVar6,dVar5 * dVar7,local_50);
            local_58 = fma(dVar6,dVar5 * dVar5,local_58);
          }
          else {
            local_70 = local_70 - dVar6;
          }
        }
        if (local_70 <= 0.0) {
          return -INFINITY;
        }
      }
      uVar9 = true;
      if (1.0 < local_70) {
        uVar9 = true;
        if ((local_48 != 0.0) || (NAN(local_48))) {
          uVar9 = local_48 == local_40 * local_40;
        }
      }
      if ((bool)uVar9 == false) {
        dVar6 = local_40 / local_70;
        __value = (int *)(-dVar6 * dVar6 + local_48 / local_70);
        uVar2 = std::isnan((double)__value);
        if ((uVar2 & 1) == 0) {
          Xc_indptr_00 = __value;
          dVar7 = std::numeric_limits<double>::epsilon();
          if ((dVar7 < (double)__value) ||
             (bVar1 = check_more_than_two_unique_values<double,int>
                                (CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                                 (size_t)dVar6,Xc_indptr_00,in_stack_ffffffffffffff60,
                                 (double *)
                                 CONCAT17(in_stack_ffffffffffffff5f,
                                          CONCAT16(uVar9,in_stack_ffffffffffffff58)),
                                 (MissingAction)((ulong)__value >> 0x20)), bVar1)) {
            if ((double)Xc_indptr_00 <= 0.0) {
              local_8 = -INFINITY;
            }
            else {
              local_b8 = (local_70 * dVar6 * dVar6 * dVar6 * dVar6 +
                         -(local_40 * 4.0) * dVar6 * dVar6 * dVar6 +
                         local_48 * 6.0 * dVar6 * dVar6 + -(local_50 * 4.0) * dVar6 + local_58) /
                         (local_70 * (double)Xc_indptr_00 * (double)Xc_indptr_00);
              uVar2 = std::isnan(local_b8);
              if (((uVar2 & 1) == 0) && (uVar2 = std::isinf(local_b8), (uVar2 & 1) == 0)) {
                if (local_b8 <= 0.0) {
                  local_b8 = 0.0;
                }
              }
              else {
                local_b8 = -INFINITY;
              }
              local_8 = local_b8;
            }
          }
          else {
            local_8 = -INFINITY;
          }
        }
        else {
          local_8 = -INFINITY;
        }
      }
      else {
        local_8 = -INFINITY;
      }
    }
  }
  return local_8;
}

Assistant:

double calc_kurtosis_weighted(size_t col_num, size_t nrows,
                              real_t *restrict Xc, sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
                              MissingAction missing_action, real_t *restrict w)
{
    if (Xc_indptr[col_num] == Xc_indptr[col_num + 1])
        return -HUGE_VAL;

    ldouble_safe s1 = 0;
    ldouble_safe s2 = 0;
    ldouble_safe s3 = 0;
    ldouble_safe s4 = 0;
    ldouble_safe x_sq;
    ldouble_safe w_this;
    ldouble_safe cnt = nrows - (Xc_indptr[col_num + 1] - Xc_indptr[col_num]);
    for (auto ix = Xc_indptr[col_num]; ix < Xc_indptr[col_num + 1]; ix++)
        cnt += w[Xc_ind[ix]];

    if (unlikely(cnt <= 0)) return -HUGE_VAL;
    
    ldouble_safe xval;

    if (missing_action != Fail)
    {
        for (auto ix = Xc_indptr[col_num]; ix < Xc_indptr[col_num + 1]; ix++)
        {
            w_this = w[Xc_ind[ix]];
            xval = Xc[ix];

            if (unlikely(is_na_or_inf(xval)))
            {
                cnt -= w_this;
            }

            else
            {
                x_sq = xval * xval;
                s1 = std::fma(w_this, xval, s1);
                s2 = std::fma(w_this, x_sq, s2);
                s3 = std::fma(w_this, x_sq*xval, s3);
                s4 = std::fma(w_this, x_sq*x_sq, s4);
                // s1 += w_this * pw1(xval);
                // s2 += w_this * pw2(xval);
                // s3 += w_this * pw3(xval);
                // s4 += w_this * pw4(xval);
            }
        }

        if (cnt <= 0) return -HUGE_VAL;
    }

    else
    {
        for (auto ix = Xc_indptr[col_num]; ix < Xc_indptr[col_num + 1]; ix++)
        {
            w_this = w[Xc_ind[ix]];
            xval = Xc[ix];

            x_sq = xval * xval;
            s1 = std::fma(w_this, xval, s1);
            s2 = std::fma(w_this, x_sq, s2);
            s3 = std::fma(w_this, x_sq*xval, s3);
            s4 = std::fma(w_this, x_sq*x_sq, s4);
            // s1 += w_this * pw1(xval);
            // s2 += w_this * pw2(xval);
            // s3 += w_this * pw3(xval);
            // s4 += w_this * pw4(xval);
        }
    }

    if (unlikely(cnt <= 1 || s2 == 0 || s2 == pw2(s1))) return -HUGE_VAL;
    ldouble_safe sn = s1 / cnt;
    ldouble_safe v  = s2 / cnt - pw2(sn);
    if (unlikely(std::isnan(v))) return -HUGE_VAL;
    if (
        v <= std::numeric_limits<double>::epsilon() &&
        !check_more_than_two_unique_values(nrows, col_num,
                                           Xc_indptr, Xc_ind, Xc,
                                           missing_action)
    )
        return -HUGE_VAL;
    if (unlikely(v <= 0)) return -HUGE_VAL;
    ldouble_safe out =  (s4 - 4 * s3 * sn + 6 * s2 * pw2(sn) - 4 * s1 * pw3(sn) + cnt * pw4(sn)) / (cnt * pw2(v));
    return (!is_na_or_inf(out))? std::fmax((double)out, 0.) : (-HUGE_VAL);
}